

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPrivate::updateCurrentPage(QWizardPrivate *this)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  QWizardPage *pQVar4;
  long in_FS_OFFSET;
  QWizardPage *local_28;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_1c = *(int *)(plVar1[1] + 0x340);
  local_28 = (QWizardPage *)0x0;
  pQVar4 = QMap<int,_QWizardPage_*>::value
                     ((QMap<int,_QWizardPage_*> *)(plVar1[1] + 0x2e0),&local_1c,&local_28);
  if (pQVar4 == (QWizardPage *)0x0) {
    this->canContinue = false;
    this->canFinish = false;
  }
  else {
    iVar3 = (**(code **)(*plVar1 + 0x1d0))(plVar1);
    this->canContinue = iVar3 != -1;
    local_1c = *(int *)(plVar1[1] + 0x340);
    local_28 = (QWizardPage *)0x0;
    pQVar4 = QMap<int,_QWizardPage_*>::value
                       ((QMap<int,_QWizardPage_*> *)(plVar1[1] + 0x2e0),&local_1c,&local_28);
    bVar2 = QWizardPage::isFinalPage(pQVar4);
    this->canFinish = bVar2;
  }
  _q_updateButtonStates(this);
  updateButtonTexts(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::updateCurrentPage()
{
    Q_Q(QWizard);
    if (q->currentPage()) {
        canContinue = (q->nextId() != -1);
        canFinish = q->currentPage()->isFinalPage();
    } else {
        canContinue = false;
        canFinish = false;
    }
    _q_updateButtonStates();
    updateButtonTexts();
}